

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void Kf_ObjSetCuts(Kf_Man_t *p,int i,Vec_Int_t *vVec)

{
  int iVar1;
  int *pArray;
  Vec_Int_t *vVec_local;
  int i_local;
  Kf_Man_t *p_local;
  
  pArray = Vec_IntArray(vVec);
  iVar1 = Vec_IntSize(vVec);
  iVar1 = Vec_SetAppend(&p->pMem,pArray,iVar1);
  Vec_IntWriteEntry(&p->vCuts,i,iVar1);
  return;
}

Assistant:

static inline void  Kf_ObjSetCuts( Kf_Man_t * p, int i, Vec_Int_t * vVec ) { Vec_IntWriteEntry(&p->vCuts, i, Vec_SetAppend(&p->pMem, Vec_IntArray(vVec), Vec_IntSize(vVec)));  }